

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::TcpSocket::TcpSocket(TcpSocket *this)

{
  undefined4 *in_RDI;
  size_t in_stack_00000008;
  RollingBuffer *in_stack_00000010;
  HostAddress *this_00;
  
  *in_RDI = 0;
  this_00 = (HostAddress *)(in_RDI + 2);
  std::__cxx11::string::string((string *)this_00);
  *(undefined2 *)(in_RDI + 10) = 0;
  HostAddress::HostAddress(this_00);
  *(undefined8 *)(in_RDI + 0x1c) = 0;
  in_RDI[0x1e] = 0xffffffff;
  RollingBuffer::RollingBuffer(in_stack_00000010,in_stack_00000008);
  in_RDI[0x3e] = 0xfffffffe;
  in_RDI[0x3f] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x40));
  return;
}

Assistant:

TcpSocket::TcpSocket()
    : m_mode(IBamIODevice::NotOpen)
    //    , m_localPort(0)
    , m_remotePort(0)
    , m_engine(0)
    , m_cachedSocketDescriptor(-1)
    , m_readBuffer(DEFAULT_BUFFER_SIZE)
    , m_error(TcpSocket::NoError)
    , m_state(TcpSocket::UnconnectedState)
{}